

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

bool __thiscall
cmsys::SystemInformationImplementation::RetrieveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  int *piVar1;
  double dVar2;
  pointer ppcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  long lVar7;
  ostream *poVar8;
  ulonglong uVar9;
  char **index;
  pointer ppcVar10;
  char *__nptr;
  uint uVar11;
  bool bVar12;
  float fVar13;
  string cpuflags;
  string buffer;
  string cpurev;
  string familyStr;
  string CPUSpeed;
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string Cores;
  string idc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  set<int,_std::less<int>,_std::allocator<int>_> PhysicalIDs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/cpuinfo");
    std::endl<char,std::char_traits<char>>(poVar8);
    goto LAB_004070d6;
  }
  while (iVar4 = feof(__stream), iVar4 == 0) {
    fgetc(__stream);
    std::__cxx11::string::push_back((char)&buffer);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&buffer);
  while (lVar7 = std::__cxx11::string::find((char *)&buffer,0x5be867), lVar7 != -1) {
    this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
  }
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header;
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_e0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&idc,this,&local_e0,"physical id",0);
  std::__cxx11::string::~string((string *)&local_e0);
  while (this->CurrentPositionInFile != 0xffffffffffffffff) {
    CPUSpeed._M_dataplus._M_p._0_4_ = atoi(idc._M_dataplus._M_p);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &PhysicalIDs,(int *)&CPUSpeed);
    std::__cxx11::string::string((string *)&local_50,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&Cores,this,&local_50,"physical id",this->CurrentPositionInFile + 1)
    ;
    std::__cxx11::string::operator=((string *)&idc,(string *)&Cores);
    std::__cxx11::string::~string((string *)&Cores);
    std::__cxx11::string::~string((string *)&local_50);
  }
  bVar12 = PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar4 = (int)PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string((string *)&local_100,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&Cores,this,&local_100,"cpu cores",0);
  std::__cxx11::string::~string((string *)&local_100);
  if (Cores._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_120,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&CPUSpeed,this,&local_120,"ncpus probed",0);
    std::__cxx11::string::operator=((string *)&Cores,(string *)&CPUSpeed);
    std::__cxx11::string::~string((string *)&CPUSpeed);
    std::__cxx11::string::~string((string *)&local_120);
  }
  iVar5 = atoi(Cores._M_dataplus._M_p);
  iVar4 = (iVar4 + (uint)bVar12) * (iVar5 + (uint)(iVar5 == 0));
  uVar11 = iVar4 + (uint)(iVar4 == 0);
  this->NumberOfPhysicalCPU = uVar11;
  uVar6 = this->NumberOfLogicalCPU;
  if (this->NumberOfLogicalCPU == 0) {
    this->NumberOfLogicalCPU = uVar11;
    uVar6 = uVar11;
  }
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical = uVar6 / uVar11;
  std::__cxx11::string::string((string *)&local_140,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&CPUSpeed,this,&local_140,"cpu MHz",0);
  std::__cxx11::string::~string((string *)&local_140);
  if (CPUSpeed._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_160,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&familyStr,this,&local_160,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&CPUSpeed,(string *)&familyStr);
    std::__cxx11::string::~string((string *)&familyStr);
    std::__cxx11::string::~string((string *)&local_160);
    if (CPUSpeed._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_180,(string *)&buffer);
      ExtractValueFromCpuInfoFile(&familyStr,this,&local_180,"CPU0ClkTck",0);
      std::__cxx11::string::operator=((string *)&CPUSpeed,(string *)&familyStr);
      std::__cxx11::string::~string((string *)&familyStr);
      std::__cxx11::string::~string((string *)&local_180);
      __nptr = (char *)CONCAT44(CPUSpeed._M_dataplus._M_p._4_4_,(int)CPUSpeed._M_dataplus._M_p);
      iVar4 = 10;
    }
    else {
      __nptr = (char *)CONCAT44(CPUSpeed._M_dataplus._M_p._4_4_,(int)CPUSpeed._M_dataplus._M_p);
      iVar4 = 0x10;
    }
    uVar9 = strtoull(__nptr,(char **)0x0,iVar4);
    fVar13 = (float)uVar9 / 1e+06;
  }
  else {
    dVar2 = atof((char *)CONCAT44(CPUSpeed._M_dataplus._M_p._4_4_,(int)CPUSpeed._M_dataplus._M_p));
    fVar13 = (float)dVar2;
  }
  this->CPUSpeedInMHz = fVar13;
  std::__cxx11::string::string((string *)&local_1a0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&familyStr,this,&local_1a0,"cpu family",0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (familyStr._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_1c0,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpurev,this,&local_1c0,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&familyStr,(string *)&cpurev);
    std::__cxx11::string::~string((string *)&cpurev);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  iVar4 = atoi(familyStr._M_dataplus._M_p);
  (this->ChipID).Family = iVar4;
  std::__cxx11::string::string((string *)&local_1e0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_1e0,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&cpurev);
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&local_1e0);
  FindManufacturer(this,&familyStr);
  if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
    bVar12 = std::operator==(&familyStr,"PA-RISC 1.1a");
    iVar4 = 0x11a;
    if (!bVar12) {
      bVar12 = std::operator==(&familyStr,"PA-RISC 2.0");
      iVar4 = 0x200;
      if (!bVar12) goto LAB_00406bab;
    }
    (this->ChipID).Family = iVar4;
  }
LAB_00406bab:
  std::__cxx11::string::string((string *)&local_200,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_200,"model",0);
  iVar4 = atoi(cpurev._M_dataplus._M_p);
  (this->ChipID).Model = iVar4;
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&local_200);
  bVar12 = RetrieveClassicalCPUIdentity(this);
  if (!bVar12) {
    std::__cxx11::string::string((string *)&local_220,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpurev,this,&local_220,"cpu",0);
    std::__cxx11::string::~string((string *)&local_220);
    if (cpurev._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(this->ChipID).ProcessorName);
    }
    std::__cxx11::string::~string((string *)&cpurev);
  }
  std::__cxx11::string::string((string *)&local_240,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_240,"stepping",0);
  std::__cxx11::string::~string((string *)&local_240);
  if (cpurev._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_260,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpuflags,this,&local_260,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&cpurev,(string *)&cpuflags);
    std::__cxx11::string::~string((string *)&cpuflags);
    std::__cxx11::string::~string((string *)&local_260);
  }
  iVar4 = atoi(cpurev._M_dataplus._M_p);
  (this->ChipID).Revision = iVar4;
  std::__cxx11::string::string((string *)&local_280,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpuflags,this,&local_280,"model name",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).ModelName,(string *)&cpuflags);
  std::__cxx11::string::~string((string *)&cpuflags);
  std::__cxx11::string::~string((string *)&local_280);
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cpuflags._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  cpuflags._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  cpuflags._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  ppcVar3 = cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->Features).L1CacheSize = 0;
  for (ppcVar10 = cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppcVar10 != ppcVar3; ppcVar10 = ppcVar10 + 1) {
    std::__cxx11::string::string((string *)&local_70,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpuflags,this,&local_70,*ppcVar10,0);
    std::__cxx11::string::~string((string *)&local_70);
    if (cpuflags._M_string_length != 0) {
      lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be932);
      if (lVar7 != -1) {
        std::__cxx11::string::resize((ulong)&cpuflags);
      }
      iVar4 = atoi(cpuflags._M_dataplus._M_p);
      piVar1 = &(this->Features).L1CacheSize;
      *piVar1 = *piVar1 + iVar4;
    }
    std::__cxx11::string::~string((string *)&cpuflags);
  }
  std::__cxx11::string::string((string *)&local_2a0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpuflags,this,&local_2a0,"flags",0);
  std::__cxx11::string::~string((string *)&local_2a0);
  if (cpurev._M_string_length != 0) {
    std::operator+(&local_2c0," ",&cpuflags);
    std::operator+(&local_90,&local_2c0," ");
    std::__cxx11::string::operator=((string *)&cpuflags,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_2c0);
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be936);
    if (lVar7 != -1) {
      (this->Features).HasFPU = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be93c);
    if (lVar7 != -1) {
      (this->Features).HasTSC = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be942);
    if (lVar7 != -1) {
      (this->Features).HasMMX = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be948);
    if (lVar7 != -1) {
      (this->Features).HasSSE = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be94e);
    if (lVar7 != -1) {
      (this->Features).HasSSE2 = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be955);
    if (lVar7 != -1) {
      (this->Features).HasAPIC = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be95c);
    if (lVar7 != -1) {
      (this->Features).HasCMOV = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be963);
    if (lVar7 != -1) {
      (this->Features).HasMTRR = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be96a);
    if (lVar7 != -1) {
      (this->Features).HasACPI = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&cpuflags,0x5be971);
    if (lVar7 != -1) {
      (this->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  std::__cxx11::string::~string((string *)&cpuflags);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&familyStr);
  std::__cxx11::string::~string((string *)&CPUSpeed);
  std::__cxx11::string::~string((string *)&Cores);
  std::__cxx11::string::~string((string *)&idc);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&PhysicalIDs._M_t);
LAB_004070d6:
  std::__cxx11::string::~string((string *)&buffer);
  return __stream != (FILE *)0x0;
}

Assistant:

bool SystemInformationImplementation::RetrieveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  std::string buffer;

  FILE* fd = fopen("/proc/cpuinfo", "r");
  if (!fd) {
    std::cout << "Problem opening /proc/cpuinfo" << std::endl;
    return false;
  }

  size_t fileSize = 0;
  while (!feof(fd)) {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
  }
  fclose(fd);
  buffer.resize(fileSize - 2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and SMT)
  size_t pos = buffer.find("processor\t");
  while (pos != std::string::npos) {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t", pos + 1);
  }

#if defined(__linux) || defined(__CYGWIN__)
  // Count sockets.
  std::set<int> PhysicalIDs;
  std::string idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id");
  while (this->CurrentPositionInFile != std::string::npos) {
    int id = atoi(idc.c_str());
    PhysicalIDs.insert(id);
    idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id",
                                            this->CurrentPositionInFile + 1);
  }
  uint64_t NumberOfSockets = PhysicalIDs.size();
  NumberOfSockets = std::max(NumberOfSockets, (uint64_t)1);
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  std::string Cores = this->ExtractValueFromCpuInfoFile(buffer, "cpu cores");
  if (Cores.empty()) {
    // Linux Sparc is different
    Cores = this->ExtractValueFromCpuInfoFile(buffer, "ncpus probed");
  }
  auto NumberOfCoresPerSocket = (unsigned int)atoi(Cores.c_str());
  NumberOfCoresPerSocket = std::max(NumberOfCoresPerSocket, 1u);
  this->NumberOfPhysicalCPU =
    NumberOfCoresPerSocket * (unsigned int)NumberOfSockets;

#else
  // For systems which do not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  std::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu count");
  this->NumberOfPhysicalCPU = this->NumberOfLogicalCPU =
    atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if (this->NumberOfPhysicalCPU <= 0) {
    this->NumberOfPhysicalCPU = 1;
  }
  if (this->NumberOfLogicalCPU == 0) {
    this->NumberOfLogicalCPU = this->NumberOfPhysicalCPU;
  }
  // LogicalProcessorsPerPhysical>1 => SMT.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical =
    this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  std::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "cpu MHz");
  if (!CPUSpeed.empty()) {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
  }
#ifdef __linux
  else {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "Cpu0ClkTck");
    if (!CPUSpeed.empty()) {
      this->CPUSpeedInMHz =
        static_cast<float>(strtoull(CPUSpeed.c_str(), nullptr, 16)) /
        1000000.0f;
    } else {
      // if the kernel is build as Sparc32 it's in decimal, note the different
      // case
      CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "CPU0ClkTck");
      this->CPUSpeedInMHz =
        static_cast<float>(strtoull(CPUSpeed.c_str(), nullptr, 10)) /
        1000000.0f;
    }
  }
#endif

  // Chip family
  std::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu family");
  if (familyStr.empty()) {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer, "CPU architecture");
  }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer, "vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP) {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
  }

  // Chip Model
  this->ChipID.Model =
    atoi(this->ExtractValueFromCpuInfoFile(buffer, "model").c_str());
  if (!this->RetrieveClassicalCPUIdentity()) {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    std::string cpuname = this->ExtractValueFromCpuInfoFile(buffer, "cpu");
    if (!cpuname.empty()) {
      this->ChipID.ProcessorName = cpuname;
    }
  }

  // Chip revision
  std::string cpurev = this->ExtractValueFromCpuInfoFile(buffer, "stepping");
  if (cpurev.empty()) {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer, "CPU revision");
  }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName =
    this->ExtractValueFromCpuInfoFile(buffer, "model name");

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  std::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache");    // e.g. PA-RISC
  cachename.push_back("D-cache");    // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (auto& index : cachename) {
    std::string cacheSize = this->ExtractValueFromCpuInfoFile(buffer, index);
    if (!cacheSize.empty()) {
      pos = cacheSize.find(" KB");
      if (pos != std::string::npos) {
        cacheSize.resize(pos);
      }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
    }
  }

  // processor feature flags (probably x86 specific)
  std::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer, "flags");
  if (!cpurev.empty()) {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ") != std::string::npos)) {
      this->Features.HasFPU = true;
    }
    if ((cpuflags.find(" tsc ") != std::string::npos)) {
      this->Features.HasTSC = true;
    }
    if ((cpuflags.find(" mmx ") != std::string::npos)) {
      this->Features.HasMMX = true;
    }
    if ((cpuflags.find(" sse ") != std::string::npos)) {
      this->Features.HasSSE = true;
    }
    if ((cpuflags.find(" sse2 ") != std::string::npos)) {
      this->Features.HasSSE2 = true;
    }
    if ((cpuflags.find(" apic ") != std::string::npos)) {
      this->Features.HasAPIC = true;
    }
    if ((cpuflags.find(" cmov ") != std::string::npos)) {
      this->Features.HasCMOV = true;
    }
    if ((cpuflags.find(" mtrr ") != std::string::npos)) {
      this->Features.HasMTRR = true;
    }
    if ((cpuflags.find(" acpi ") != std::string::npos)) {
      this->Features.HasACPI = true;
    }
    if ((cpuflags.find(" 3dnow ") != std::string::npos)) {
      this->Features.ExtendedFeatures.Has3DNow = true;
    }
  }

  return true;
}